

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void icu_63::UnicodeSet::_appendToPat(UnicodeString *buf,UChar32 c,UBool escapeUnprintable)

{
  UBool UVar1;
  
  if (((escapeUnprintable != '\0') && (UVar1 = ICU_Utility::isUnprintable(c), UVar1 != '\0')) &&
     (UVar1 = ICU_Utility::escapeUnprintable(buf,c), UVar1 != '\0')) {
    return;
  }
  if (((c - 0x24U < 0x3b) && ((0x780000000400205U >> ((ulong)(c - 0x24U) & 0x3f) & 1) != 0)) ||
     ((c == 0x7b || ((c == 0x7d || (UVar1 = PatternProps::isWhiteSpace(c), UVar1 != '\0')))))) {
    icu_63::UnicodeString::append(buf,L'\\');
  }
  icu_63::UnicodeString::append(buf,c);
  return;
}

Assistant:

void UnicodeSet::_appendToPat(UnicodeString& buf, UChar32 c, UBool
escapeUnprintable) {
    if (escapeUnprintable && ICU_Utility::isUnprintable(c)) {
        // Use hex escape notation (\uxxxx or \Uxxxxxxxx) for anything
        // unprintable
        if (ICU_Utility::escapeUnprintable(buf, c)) {
            return;
        }
    }
    // Okay to let ':' pass through
    switch (c) {
    case SET_OPEN:
    case SET_CLOSE:
    case HYPHEN:
    case COMPLEMENT:
    case INTERSECTION:
    case BACKSLASH:
    case OPEN_BRACE:
    case CLOSE_BRACE:
    case COLON:
    case SymbolTable::SYMBOL_REF:
        buf.append(BACKSLASH);
        break;
    default:
        // Escape whitespace
        if (PatternProps::isWhiteSpace(c)) {
            buf.append(BACKSLASH);
        }
        break;
    }
    buf.append(c);
}